

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall
QPainter::drawText(QPainter *this,QPointF *p,QString *str,int tf,int justificationPadding)

{
  QScriptItem *si;
  long lVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  QScriptItem *pQVar3;
  PenStyle PVar4;
  uint uVar5;
  int iVar6;
  QFixed QVar7;
  QPen *this_00;
  pointer pQVar8;
  char16_t *pcVar9;
  int j;
  int iVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long in_FS_OFFSET;
  QScriptLine local_2ff8;
  QGlyphLayout local_2fc8;
  QTextItemInt gf;
  undefined1 local_2f18 [24];
  QVarLengthArray<unsigned_char,_256LL> levels;
  QVarLengthArray<int,_256LL> visualOrder;
  QStackTextEngine engine;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
       *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
        &((_Var2._M_head_impl)->engine)._M_t !=
       (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) &&
     ((str->d).size != 0)) {
    this_00 = pen(this);
    PVar4 = QPen::style(this_00);
    if (PVar4 != NoPen) {
      QStackTextEngine::QStackTextEngine
                (&engine,str,(QFont *)((long)((_Var2._M_head_impl)->state)._M_t + 0x20));
      uVar5 = engine.super_QTextEngine.option._0_4_ & 0xffff3fff;
      engine.super_QTextEngine.option._0_4_ =
           (*(uint *)((long)((_Var2._M_head_impl)->state)._M_t + 0x1b0) & 3) << 0xe | uVar5;
      if ((tf & 0x60000U) != 0) {
        engine.super_QTextEngine._168_1_ = engine.super_QTextEngine._168_1_ | 1;
        engine.super_QTextEngine.option._0_4_ = (uVar5 | (uint)tf >> 3 & 0x4000) ^ 0x4000;
      }
      QTextEngine::itemize(&engine.super_QTextEngine);
      local_2ff8._38_2_ = 0xaaaa;
      local_2ff8.descent.val = 0;
      local_2ff8.ascent.val = 0;
      local_2ff8.leading.val = 0;
      local_2ff8.x.val = 0;
      local_2ff8.y.val = 0;
      local_2ff8.width.val = 0;
      local_2ff8._24_6_ = 0;
      local_2ff8.textAdvance.val._2_2_ = 0;
      local_2ff8.from = 0;
      local_2ff8.trailingSpaces = 0;
      local_2ff8._40_4_ = (uint)(str->d).size & 0xfffffff;
      QTextEngine::shapeLine(&engine.super_QTextEngine,&local_2ff8);
      uVar11 = ((engine.super_QTextEngine.layoutData)->items).d.size;
      memset(&visualOrder,0xaa,0x418);
      iVar10 = (int)uVar11;
      QVarLengthArray<int,_256LL>::QVarLengthArray(&visualOrder,(long)iVar10);
      memset(&levels,0xaa,0x118);
      QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray(&levels,(long)iVar10);
      uVar13 = 0;
      uVar12 = 0;
      if (0 < iVar10) {
        uVar12 = uVar11 & 0xffffffff;
      }
      lVar14 = 4;
      for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        pQVar8 = QList<QScriptItem>::data(&(engine.super_QTextEngine.layoutData)->items);
        *(undefined1 *)((long)levels.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr + uVar13)
             = *(undefined1 *)((long)&pQVar8->position + lVar14 + 2);
        lVar14 = lVar14 + 0x20;
      }
      QTextEngine::bidiReorder
                (iVar10,(quint8 *)levels.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr,
                 (int *)visualOrder.super_QVLABase<int>.super_QVLABaseBase.ptr);
      if (0 < justificationPadding) {
        engine.super_QTextEngine.option._0_4_ =
             engine.super_QTextEngine.option._0_4_ & 0xfffffe00 | 8;
        engine.super_QTextEngine._168_1_ = engine.super_QTextEngine._168_1_ | 8;
        local_2ff8.width.val = justificationPadding << 6;
        QTextEngine::justify(&engine.super_QTextEngine,&local_2ff8);
      }
      iVar10 = (int)(p->xp * 64.0);
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        iVar6 = *(int *)((long)visualOrder.super_QVLABase<int>.super_QVLABaseBase.ptr + uVar11 * 4);
        pQVar3 = ((engine.super_QTextEngine.layoutData)->items).d.ptr;
        si = pQVar3 + iVar6;
        if (((uint)pQVar3[iVar6].analysis & 0xf00) < 0x601) {
          local_2f18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_2f18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextEngine::font((QTextEngine *)local_2f18,(QScriptItem *)&engine);
          gf.glyphs.numGlyphs = -0x55555556;
          gf.glyphs._44_4_ = 0xaaaaaaaa;
          gf.fontEngine = (QFontEngine *)&DAT_aaaaaaaaaaaaaaaa;
          gf.glyphs.justifications._0_4_ = 0xaaaaaaaa;
          gf.glyphs.justifications._4_4_ = 0xaaaaaaaa;
          gf.glyphs.attributes._0_4_ = 0xaaaaaaaa;
          gf.glyphs.attributes._4_4_ = 0xaaaaaaaa;
          gf.glyphs.glyphs = (glyph_t *)&DAT_aaaaaaaaaaaaaaaa;
          gf.glyphs.advances = (QFixed *)&DAT_aaaaaaaaaaaaaaaa;
          gf.f = (QFont *)&DAT_aaaaaaaaaaaaaaaa;
          gf.glyphs.offsets = (QFixedPoint *)&DAT_aaaaaaaaaaaaaaaa;
          gf.chars = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
          gf.logClusters = (unsigned_short *)&DAT_aaaaaaaaaaaaaaaa;
          gf.charFormat.super_QTextFormat._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          gf._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          gf._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          gf.charFormat.super_QTextFormat.d.d.ptr =
               (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
          gf._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          gf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_2fc8);
          QTextItemInt::QTextItemInt(&gf,si,(QFont *)local_2f18,(QTextCharFormat *)&local_2fc8);
          QTextFormat::~QTextFormat((QTextFormat *)&local_2fc8);
          QTextEngine::shapedGlyphs(&local_2fc8,&engine.super_QTextEngine,si);
          gf.glyphs.attributes._4_4_ = local_2fc8.attributes._4_4_;
          gf.glyphs.numGlyphs = local_2fc8.numGlyphs;
          gf.glyphs.advances = local_2fc8.advances;
          gf.glyphs.offsets = local_2fc8.offsets;
          gf.glyphs.glyphs = local_2fc8.glyphs;
          pcVar9 = ((engine.super_QTextEngine.layoutData)->string).d.ptr;
          if (pcVar9 == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          gf.chars = (QChar *)(pcVar9 + si->position);
          iVar6 = QTextEngine::length(&engine.super_QTextEngine,iVar6);
          gf.num_chars = iVar6;
          if ((engine.super_QTextEngine._168_1_ & 8) == 0) {
            gf.width.val = (si->width).val;
          }
          else {
            for (iVar6 = 0; iVar6 < gf.glyphs.numGlyphs; iVar6 = iVar6 + 1) {
              QVar7 = QGlyphLayout::effectiveAdvance(&gf.glyphs,iVar6);
              gf.width.val = gf.width.val + QVar7.val;
            }
          }
          gf.logClusters = (engine.super_QTextEngine.layoutData)->logClustersPtr + si->position;
          local_2fc8.offsets = (QFixedPoint *)((double)iVar10 * 0.015625);
          local_2fc8.glyphs = (glyph_t *)p->yp;
          drawTextItem(this,(QPointF *)&local_2fc8,(QTextItem *)&gf);
          QVar7.val = gf.width.val;
          QTextFormat::~QTextFormat(&gf.charFormat.super_QTextFormat);
          QFont::~QFont((QFont *)local_2f18);
        }
        else {
          QVar7.val = (si->width).val;
        }
        iVar10 = iVar10 + QVar7.val;
      }
      QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray(&levels);
      QVarLengthArray<int,_256LL>::~QVarLengthArray(&visualOrder);
      QStackTextEngine::~QStackTextEngine(&engine);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawText(const QPointF &p, const QString &str, int tf, int justificationPadding)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawText(), pos=[%.2f,%.2f], str='%s'\n", p.x(), p.y(), str.toLatin1().constData());
#endif

    Q_D(QPainter);

    if (!d->engine || str.isEmpty() || pen().style() == Qt::NoPen)
        return;

    Q_DECL_UNINITIALIZED QStackTextEngine engine(str, d->state->font);
    engine.option.setTextDirection(d->state->layoutDirection);
    if (tf & (Qt::TextForceLeftToRight|Qt::TextForceRightToLeft)) {
        engine.ignoreBidi = true;
        engine.option.setTextDirection((tf & Qt::TextForceLeftToRight) ? Qt::LeftToRight : Qt::RightToLeft);
    }
    engine.itemize();
    QScriptLine line;
    line.length = str.size();
    engine.shapeLine(line);

    int nItems = engine.layoutData->items.size();
    QVarLengthArray<int> visualOrder(nItems);
    QVarLengthArray<uchar> levels(nItems);
    for (int i = 0; i < nItems; ++i)
        levels[i] = engine.layoutData->items[i].analysis.bidiLevel;
    QTextEngine::bidiReorder(nItems, levels.data(), visualOrder.data());

    if (justificationPadding > 0) {
        engine.option.setAlignment(Qt::AlignJustify);
        engine.forceJustification = true;
        // this works because justify() is only interested in the difference between width and textWidth
        line.width = justificationPadding;
        engine.justify(line);
    }
    QFixed x = QFixed::fromReal(p.x());

    for (int i = 0; i < nItems; ++i) {
        int item = visualOrder[i];
        const QScriptItem &si = engine.layoutData->items.at(item);
        if (si.analysis.flags >= QScriptAnalysis::TabOrObject) {
            x += si.width;
            continue;
        }
        QFont f = engine.font(si);
        QTextItemInt gf(si, &f);
        gf.glyphs = engine.shapedGlyphs(&si);
        gf.chars = engine.layoutData->string.unicode() + si.position;
        gf.num_chars = engine.length(item);
        if (engine.forceJustification) {
            for (int j=0; j<gf.glyphs.numGlyphs; ++j)
                gf.width += gf.glyphs.effectiveAdvance(j);
        } else {
            gf.width = si.width;
        }
        gf.logClusters = engine.logClusters(&si);

        drawTextItem(QPointF(x.toReal(), p.y()), gf);

        x += gf.width;
    }
}